

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O3

void Curl_conn_ev_data_done(Curl_easy *data,_Bool premature)

{
  connectdata *pcVar1;
  Curl_cft_cntrl *pCVar2;
  bool bVar3;
  long lVar4;
  bool bVar5;
  undefined7 in_register_00000031;
  Curl_cfilter *pCVar6;
  
  pcVar1 = data->conn;
  lVar4 = 0;
  bVar3 = true;
  do {
    bVar5 = bVar3;
    for (pCVar6 = pcVar1->cfilter[lVar4]; pCVar6 != (Curl_cfilter *)0x0; pCVar6 = pCVar6->next) {
      pCVar2 = pCVar6->cft->cntrl;
      if (pCVar2 != Curl_cf_def_cntrl) {
        (*pCVar2)(pCVar6,data,7,(int)CONCAT71(in_register_00000031,premature),(void *)0x0);
      }
    }
    lVar4 = 1;
    bVar3 = false;
  } while (bVar5);
  return;
}

Assistant:

void Curl_conn_ev_data_done(struct Curl_easy *data, bool premature)
{
  cf_cntrl_all(data->conn, data, TRUE, CF_CTRL_DATA_DONE, premature, NULL);
}